

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void leveldb::SaveValue(void *arg,Slice *ikey,Slice *v)

{
  bool bVar1;
  int iVar2;
  ParsedInternalKey parsed_key;
  ParsedInternalKey local_30;
  
  local_30.user_key.data_ = "";
  local_30.user_key.size_ = 0;
  bVar1 = ParseInternalKey(ikey,&local_30);
  if (bVar1) {
    iVar2 = (**(code **)(**(long **)((long)arg + 8) + 0x10))
                      (*(long **)((long)arg + 8),&local_30,(long)arg + 0x10);
    if ((iVar2 == 0) &&
       (*(uint *)arg = (local_30.type != kTypeValue) + 1, local_30.type == kTypeValue)) {
      std::__cxx11::string::assign(*(char **)((long)arg + 0x20),(ulong)v->data_);
    }
  }
  else {
    *(undefined4 *)arg = 3;
  }
  return;
}

Assistant:

static void SaveValue(void* arg, const Slice& ikey, const Slice& v) {
  Saver* s = reinterpret_cast<Saver*>(arg);
  ParsedInternalKey parsed_key;
  if (!ParseInternalKey(ikey, &parsed_key)) {
    s->state = kCorrupt;
  } else {
    if (s->ucmp->Compare(parsed_key.user_key, s->user_key) == 0) {
      s->state = (parsed_key.type == kTypeValue) ? kFound : kDeleted;
      if (s->state == kFound) {
        s->value->assign(v.data(), v.size());
      }
    }
  }
}